

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::ReturnValueVerifier::operator()
          (ReturnValueVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  ostringstream *this_00;
  ostringstream *this_01;
  ChannelType CVar1;
  bool bVar2;
  long *plVar3;
  char *__s;
  undefined8 *puVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_type *psVar6;
  ConstPixelBufferAccess *__n;
  int iVar7;
  void *__buf;
  Vector<int,_2> (*arr) [5];
  float (*arr_00) [5];
  Vector<int,_3> (*arr_01) [5];
  float (*arr_02) [5];
  int iVar8;
  AtomicOperation operation;
  uint y;
  int iVar9;
  int z;
  long lVar10;
  ReturnValueVerifier *pRVar11;
  ReturnValueVerifier *pRVar12;
  int i;
  long lVar13;
  bool bVar14;
  float valueSoFar;
  IVec2 pixelCoords [5];
  IntFloatArr atomicArgs;
  IntFloatArr returnValues;
  IVec3 invocationGlobalIDs [5];
  allocator<char> local_619;
  int local_618;
  int local_614;
  string local_610;
  ReturnValueVerifier *local_5f0;
  ConstPixelBufferAccess *local_5e8;
  int local_5dc;
  long *local_5d8 [2];
  long local_5c8 [2];
  string local_5b8;
  undefined8 local_598;
  Functional local_588 [20];
  Functional local_574 [20];
  TestLog *local_560;
  string local_558;
  string local_538;
  undefined8 local_518;
  int aiStack_510 [2];
  long local_508 [3];
  undefined4 uStack_4f0;
  undefined4 local_4ec;
  undefined4 uStack_4e8;
  undefined8 uStack_4e4;
  string local_4d0;
  undefined1 local_4b0 [112];
  ios_base local_440 [8];
  ios_base local_438 [264];
  undefined1 local_330 [8];
  _func_int **local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [6];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  CVar1 = (resultSlice->m_format).type;
  if ((0x21 < (ulong)CVar1) || (bVar14 = true, (0x2c0000000U >> ((ulong)CVar1 & 0x3f) & 1) == 0)) {
    bVar14 = CVar1 - SIGNED_INT8 < 3;
  }
  iVar7 = (resultSlice->m_size).m_data[0];
  local_618 = (resultSlice->m_size).m_data[1];
  local_5e8 = resultSlice;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
  std::ostream::operator<<((ostringstream *)local_4b0,sliceOrFaceNdx);
  std::__cxx11::stringbuf::str();
  local_5f0 = this;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
  std::ios_base::~ios_base(local_440);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_518,0,(char *)0x0,0x1c5020b);
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 == paVar5) {
    local_320[0]._0_8_ = paVar5->_M_allocated_capacity;
    local_320[0]._8_8_ = plVar3[3];
    local_330 = (undefined1  [8])local_320;
  }
  else {
    local_320[0]._0_8_ = paVar5->_M_allocated_capacity;
    local_330 = (undefined1  [8])*plVar3;
  }
  local_328 = (_func_int **)plVar3[1];
  *plVar3 = (long)paVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_5f0->m_imageType == TEXTURETYPE_CUBE) {
    __s = glu::getCubeMapFaceName
                    ((&DAT_01c4f134)
                     [(int)(&Functional::(anonymous_namespace)::glslImageFuncZToCubeFace(int)::faces
                           )[sliceOrFaceNdx]]);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_5d8,__s,&local_619);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)local_5d8,0,(char *)0x0,0x1cb8076);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
    std::ostream::operator<<(local_4b0,sliceOrFaceNdx);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
    std::ios_base::~ios_base(local_440);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)local_5d8,0,(char *)0x0,0x1c4fc47);
  }
  local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  psVar6 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_610.field_2._M_allocated_capacity = *psVar6;
    local_610.field_2._8_8_ = puVar4[3];
  }
  else {
    local_610.field_2._M_allocated_capacity = *psVar6;
    local_610._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_610._M_string_length = puVar4[1];
  *puVar4 = psVar6;
  puVar4[1] = 0;
  *(undefined1 *)psVar6 = 0;
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_610,0,(char *)0x0,0x1c50218);
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_5b8.field_2._M_allocated_capacity = *psVar6;
    local_5b8.field_2._8_8_ = plVar3[3];
    local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  }
  else {
    local_5b8.field_2._M_allocated_capacity = *psVar6;
    local_5b8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_5b8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  __n = local_5e8;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,(string *)local_330,&local_5b8,local_5e8,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1b0,(int)log,__buf,(size_t)__n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
  }
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0],local_5c8[0] + 1);
  }
  if (local_330 != (undefined1  [8])local_320) {
    operator_delete((void *)local_330,local_320[0]._M_allocated_capacity + 1);
  }
  pRVar12 = local_5f0;
  if (local_518 != local_508) {
    operator_delete(local_518,local_508[0] + 1);
  }
  iVar8 = (pRVar12->m_endResultImageLayerSize).m_data[1];
  if (0 < iVar8) {
    iVar7 = iVar7 * sliceOrFaceNdx;
    local_614 = sliceOrFaceNdx * sliceOrFaceNdx;
    iVar9 = (pRVar12->m_endResultImageLayerSize).m_data[0];
    lVar10 = 0;
    local_5dc = local_614;
    local_560 = log;
    do {
      if (0 < iVar9) {
        z = (int)lVar10;
        local_614 = z * z + local_614;
        iVar8 = 0;
        do {
          uStack_4e8 = 0;
          uStack_4e4 = 0;
          local_508[2] = 0;
          uStack_4f0 = 0;
          local_4ec = 0;
          local_508[0] = 0;
          local_508[1] = 0;
          local_518 = (long *)0x0;
          aiStack_510[0] = 0;
          aiStack_510[1] = 0;
          local_5b8.field_2._M_allocated_capacity = 0;
          local_5b8.field_2._8_8_ = 0;
          local_5b8._M_dataplus._M_p = (pointer)0x0;
          local_5b8._M_string_length = 0;
          local_598 = 0;
          lVar13 = 0;
          pRVar11 = pRVar12;
          do {
            while( true ) {
              y = (pRVar11->m_endResultImageLayerSize).m_data[0] * (int)lVar13 + iVar8;
              *(uint *)((long)&local_518 + lVar13 * 0xc) = y;
              *(int *)((long)&local_518 + lVar13 * 0xc + 4) = z;
              aiStack_510[lVar13 * 3] = sliceOrFaceNdx;
              (&local_5b8._M_dataplus)[lVar13]._M_p = (pointer)(lVar10 << 0x20 | (ulong)y);
              if (!bVar14) break;
              tcu::ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_4b0,(int)local_5e8,y,z);
              pRVar12 = local_5f0;
              *(undefined4 *)(local_574 + lVar13 * 4) = local_4b0._0_4_;
              operation = pRVar11->m_operation;
              if ((ulong)operation < 6) {
                iVar9 = y * y + local_614;
              }
              else {
                iVar9 = -1;
                if (operation == ATOMIC_OPERATION_EXCHANGE) {
                  iVar9 = (y + iVar7) * local_618 + z;
                }
              }
              *(int *)(local_588 + lVar13 * 4) = iVar9;
              lVar13 = lVar13 + 1;
              pRVar11 = local_5f0;
              if (lVar13 == 5) {
                if (bVar14) {
                  iVar9 = -1;
                  if (operation < ATOMIC_OPERATION_COMP_SWAP) {
                    iVar9 = *(int *)(&DAT_01c4f14c + (ulong)operation * 4);
                  }
                  local_4b0._0_8_ = local_4b0._0_8_ & 0xffffff0000000000;
                  bVar2 = verifyRecursive<int>
                                    (operation,0,iVar9,(bool (*) [5])local_4b0,
                                     (int (*) [5])local_588,(int (*) [5])local_574);
                  goto LAB_0147e2c5;
                }
                goto LAB_0147e278;
              }
            }
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)local_4b0,(int)local_5e8,y,z);
            *(undefined4 *)(local_574 + lVar13 * 4) = local_4b0._0_4_;
            operation = pRVar11->m_operation;
            if (operation < ATOMIC_OPERATION_EXCHANGE) {
              iVar9 = y * y + local_614;
            }
            else {
              iVar9 = -1;
              if (operation == ATOMIC_OPERATION_EXCHANGE) {
                iVar9 = (y + iVar7) * local_618 + z;
              }
            }
            *(float *)(local_588 + lVar13 * 4) = (float)iVar9;
            lVar13 = lVar13 + 1;
            pRVar11 = local_5f0;
          } while (lVar13 != 5);
LAB_0147e278:
          pRVar12 = local_5f0;
          valueSoFar = -1.0;
          if (operation < ATOMIC_OPERATION_COMP_SWAP) {
            valueSoFar = *(float *)(&DAT_01c4f168 + (ulong)operation * 4);
          }
          local_4b0._0_8_ = local_4b0._0_8_ & 0xffffff0000000000;
          bVar2 = verifyRecursive<float>
                            (operation,0,valueSoFar,(bool (*) [5])local_4b0,(float (*) [5])local_588
                             ,(float (*) [5])local_574);
LAB_0147e2c5:
          if (bVar2 == false) {
            local_330 = (undefined1  [8])local_560;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_328,"// Failure: intermediate return values at pixels ",
                       0x31);
            arrayStr<tcu::Vector<int,2>,5>(&local_610,(Functional *)&local_5b8,arr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_328,local_610._M_dataplus._M_p,local_610._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_328," of current layer are ",0x16);
            if (bVar14) {
              arrayStr<int,5>(&local_538,local_574,(int (*) [5])arr_00);
            }
            else {
              arrayStr<float,5>(&local_538,local_574,arr_00);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_328,local_538._M_dataplus._M_p,local_538._M_string_length);
            local_1b0._0_8_ =
                 tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
            this_00 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"// Note: relevant shader invocation global IDs are ",0x33
                      );
            arrayStr<tcu::Vector<int,3>,5>(&local_4d0,(Functional *)&local_518,arr_01);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
            local_4b0._0_8_ =
                 tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
            this_01 = (ostringstream *)(local_4b0 + 8);
            std::__cxx11::ostringstream::ostringstream(this_01);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_01,"// Note: data expression values for the IDs are ",0x30);
            if (bVar14) {
              arrayStr<int,5>(&local_558,local_588,(int (*) [5])arr_02);
            }
            else {
              arrayStr<float,5>(&local_558,local_588,arr_02);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_01,local_558._M_dataplus._M_p,local_558._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_01,
                       "; return values are not a valid result for any order of operations",0x42);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_558._M_dataplus._M_p != &local_558.field_2) {
              operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream(this_01);
            std::ios_base::~ios_base(local_438);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
              operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_538._M_dataplus._M_p != &local_538.field_2) {
              operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_610._M_dataplus._M_p != &local_610.field_2) {
              operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
            std::ios_base::~ios_base(local_2b8);
            return false;
          }
          iVar8 = iVar8 + 1;
          iVar9 = (pRVar12->m_endResultImageLayerSize).m_data[0];
        } while (iVar8 < iVar9);
        iVar8 = (pRVar12->m_endResultImageLayerSize).m_data[1];
        local_614 = local_5dc;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar8);
  }
  return true;
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		const bool		isIntegerFormat		(isFormatTypeInteger(resultSlice.getFormat().type));
		const IVec2		dispatchSizeXY	(resultSlice.getWidth(), resultSlice.getHeight());

		DE_ASSERT(resultSlice.getWidth()	== NUM_INVOCATIONS_PER_PIXEL*m_endResultImageLayerSize.x()	&&
				  resultSlice.getHeight()	== m_endResultImageLayerSize.y()							&&
				  resultSlice.getDepth()	== 1);

		log << TestLog::Image("ReturnValues" + toString(sliceOrFaceNdx),
							  "Per-Invocation Return Values, "
								   + (m_imageType == TEXTURETYPE_CUBE ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
																	  : "slice " + toString(sliceOrFaceNdx)),
							  resultSlice);

		for (int y = 0; y < m_endResultImageLayerSize.y(); y++)
		for (int x = 0; x < m_endResultImageLayerSize.x(); x++)
		{
			union IntFloatArr
			{
				int		i[NUM_INVOCATIONS_PER_PIXEL];
				float	f[NUM_INVOCATIONS_PER_PIXEL];
			};

			// Get the atomic function args and return values for all the invocations that contribute to the pixel (x, y) in the current end result slice.

			IntFloatArr		returnValues;
			IntFloatArr		atomicArgs;
			IVec3			invocationGlobalIDs[NUM_INVOCATIONS_PER_PIXEL];
			IVec2			pixelCoords[NUM_INVOCATIONS_PER_PIXEL];

			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				const IVec2 pixCoord	(x + i*m_endResultImageLayerSize.x(), y);
				const IVec3 gid			(pixCoord.x(), pixCoord.y(), sliceOrFaceNdx);

				invocationGlobalIDs[i]	= gid;
				pixelCoords[i]			= pixCoord;

				if (isIntegerFormat)
				{
					returnValues.i[i]	= resultSlice.getPixelInt(gid.x(), y).x();
					atomicArgs.i[i]		= getAtomicFuncArgument(m_operation, gid, dispatchSizeXY);
				}
				else
				{
					returnValues.f[i]	= resultSlice.getPixel(gid.x(), y).x();
					atomicArgs.f[i]		= (float)getAtomicFuncArgument(m_operation, gid, dispatchSizeXY);
				}
			}

			// Verify that the return values form a valid sequence.

			{
				const bool success = isIntegerFormat ? verifyOperationAccumulationIntermediateValues(m_operation,
																									 getOperationInitialValue(m_operation),
																									 atomicArgs.i,
																									 returnValues.i)

													 : verifyOperationAccumulationIntermediateValues(m_operation,
																									 (float)getOperationInitialValue(m_operation),
																									 atomicArgs.f,
																									 returnValues.f);

				if (!success)
				{
					log << TestLog::Message << "// Failure: intermediate return values at pixels " << arrayStr(pixelCoords) << " of current layer are "
											<< (isIntegerFormat ? arrayStr(returnValues.i) : arrayStr(returnValues.f)) << TestLog::EndMessage
						<< TestLog::Message << "// Note: relevant shader invocation global IDs are " << arrayStr(invocationGlobalIDs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: data expression values for the IDs are "
											<< (isIntegerFormat ? arrayStr(atomicArgs.i) : arrayStr(atomicArgs.f))
											<< "; return values are not a valid result for any order of operations" << TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}